

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_test.cc
# Opt level: O0

void anon_unknown.dwarf_1933e1::FiltersWontSaturateWhenAddedPairwise(void)

{
  bool bVar1;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int p3;
  int p2;
  int p1;
  int p0;
  int i;
  InterpKernel *filters;
  InterpFilter filter;
  int filter_bank;
  int subpel_search;
  AssertHelper *in_stack_fffffffffffffe40;
  int *in_stack_fffffffffffffe48;
  char *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  AssertHelper *in_stack_fffffffffffffe70;
  AssertionResult local_168 [2];
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  AssertHelper *in_stack_fffffffffffffec0;
  AssertionResult local_118 [2];
  undefined4 local_f8;
  int local_f4;
  AssertionResult local_f0 [2];
  undefined4 local_cc;
  AssertionResult local_c8 [2];
  undefined4 local_a4;
  AssertionResult local_a0 [2];
  undefined4 local_7c;
  AssertionResult local_78 [3];
  undefined4 local_44;
  AssertionResult local_40;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int16_t *local_18;
  InterpFilter local_9;
  int local_8;
  int local_4;
  
  for (local_4 = 1; local_4 < 4; local_4 = local_4 + 1) {
    for (local_8 = 0; local_8 < 3; local_8 = local_8 + 1) {
      local_9 = (InterpFilter)local_8;
      local_18 = av1_get_interp_filter_kernel(local_9,local_4);
      for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
        local_20 = (int)local_18[(long)local_1c * 8] + (int)local_18[(long)local_1c * 8 + 1];
        local_24 = (int)local_18[(long)local_1c * 8 + 2] + (int)local_18[(long)local_1c * 8 + 3];
        local_28 = (int)local_18[(long)local_1c * 8 + 4] + (int)local_18[(long)local_1c * 8 + 5];
        local_2c = (int)local_18[(long)local_1c * 8 + 6] + (int)local_18[(long)local_1c * 8 + 7];
        local_44 = 0x80;
        testing::internal::CmpHelperLE<int,int>
                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (int *)in_stack_fffffffffffffe40);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_40);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe70);
          testing::AssertionResult::failure_message((AssertionResult *)0x446753);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe70,(Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                     in_stack_fffffffffffffe50);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffec0,
                     (Message *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe40);
          testing::Message::~Message((Message *)0x4467b0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x44681e);
        local_7c = 0x80;
        testing::internal::CmpHelperLE<int,int>
                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (int *)in_stack_fffffffffffffe40);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_78);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe70);
          in_stack_fffffffffffffe70 =
               (AssertHelper *)
               testing::AssertionResult::failure_message((AssertionResult *)0x44689a);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe70,(Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                     in_stack_fffffffffffffe50);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffec0,
                     (Message *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe40);
          testing::Message::~Message((Message *)0x4468f7);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x446965);
        local_a4 = 0x80;
        testing::internal::CmpHelperLE<int,int>
                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (int *)in_stack_fffffffffffffe40);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe70);
          in_stack_fffffffffffffe68 =
               testing::AssertionResult::failure_message((AssertionResult *)0x4469e1);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe70,(Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                     in_stack_fffffffffffffe50);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffec0,
                     (Message *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe40);
          testing::Message::~Message((Message *)0x446a3e);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x446aac);
        local_cc = 0x80;
        testing::internal::CmpHelperLE<int,int>
                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (int *)in_stack_fffffffffffffe40);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c8);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe70);
          in_stack_fffffffffffffe60 =
               testing::AssertionResult::failure_message((AssertionResult *)0x446b28);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe70,(Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                     in_stack_fffffffffffffe50);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffec0,
                     (Message *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe40);
          testing::Message::~Message((Message *)0x446b85);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x446bf3);
        local_f4 = local_20 + local_2c;
        local_f8 = 0x80;
        testing::internal::CmpHelperLE<int,int>
                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (int *)in_stack_fffffffffffffe40);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe70);
          in_stack_fffffffffffffe58 =
               testing::AssertionResult::failure_message((AssertionResult *)0x446c84);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe70,(Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                     in_stack_fffffffffffffe50);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffec0,
                     (Message *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe40);
          testing::Message::~Message((Message *)0x446ce1);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x446d4f);
        testing::internal::CmpHelperLE<int,int>
                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (int *)in_stack_fffffffffffffe40);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_118);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe70);
          in_stack_fffffffffffffe50 =
               testing::AssertionResult::failure_message((AssertionResult *)0x446de7);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe70,(Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                     in_stack_fffffffffffffe50);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffec0,
                     (Message *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe40);
          testing::Message::~Message((Message *)0x446e44);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x446eb2);
        in_stack_fffffffffffffebc = local_20 + local_2c + local_24 + local_28;
        in_stack_fffffffffffffeb8 = 0x80;
        testing::internal::CmpHelperLE<int,int>
                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (int *)in_stack_fffffffffffffe40);
        bVar1 = testing::AssertionResult::operator_cast_to_bool
                          ((AssertionResult *)&stack0xfffffffffffffec0);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe70);
          in_stack_fffffffffffffe48 =
               (int *)testing::AssertionResult::failure_message((AssertionResult *)0x446f4e);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe70,(Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                     in_stack_fffffffffffffe50);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffec0,
                     (Message *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe40);
          testing::Message::~Message((Message *)0x446f9c);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x447004);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (int *)in_stack_fffffffffffffe40);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(local_168);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe70);
          in_stack_fffffffffffffe40 =
               (AssertHelper *)
               testing::AssertionResult::failure_message((AssertionResult *)0x44708b);
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe70,(Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                     in_stack_fffffffffffffe50);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffec0,
                     (Message *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
          testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe40);
          testing::Message::~Message((Message *)0x4470d9);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x44713b);
      }
    }
  }
  return;
}

Assistant:

void FiltersWontSaturateWhenAddedPairwise() {
  int subpel_search;
  for (subpel_search = USE_2_TAPS; subpel_search <= USE_8_TAPS;
       ++subpel_search) {
    for (int filter_bank = 0; filter_bank < kNumFilterBanks; ++filter_bank) {
      const InterpFilter filter = (InterpFilter)filter_bank;
      const InterpKernel *filters =
          (const InterpKernel *)av1_get_interp_filter_kernel(filter,
                                                             subpel_search);
      for (int i = 0; i < kNumFilters; i++) {
        const int p0 = filters[i][0] + filters[i][1];
        const int p1 = filters[i][2] + filters[i][3];
        const int p2 = filters[i][4] + filters[i][5];
        const int p3 = filters[i][6] + filters[i][7];
        EXPECT_LE(p0, 128);
        EXPECT_LE(p1, 128);
        EXPECT_LE(p2, 128);
        EXPECT_LE(p3, 128);
        EXPECT_LE(p0 + p3, 128);
        EXPECT_LE(p0 + p3 + p1, 128);
        EXPECT_LE(p0 + p3 + p1 + p2, 128);
        EXPECT_EQ(p0 + p1 + p2 + p3, 128);
      }
    }
  }
}